

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_network.cpp
# Opt level: O3

void __thiscall polyscope::CurveNetwork::buildCustomUI(CurveNetwork *this)

{
  vec<3,_float,_(glm::qualifier)0> *col;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar1;
  undefined3 uVar2;
  float fVar3;
  bool bVar4;
  size_t sVar5;
  size_t sVar6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  
  sVar5 = render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::size
                    ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)
                     &(this->super_QuantityStructure<polyscope::CurveNetwork>).field_0x428);
  sVar6 = render::ManagedBuffer<unsigned_int>::size(&this->edgeTailInds);
  ImGui::Text("nodes: %lld  edges: %lld",sVar5,sVar6);
  col = &(this->color).value;
  bVar4 = ImGui::ColorEdit3("Color",(float *)col,0x20);
  if (bVar4) {
    pmVar7 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<3,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<3,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&detail::persistentCache_glmvec3,&(this->color).name);
    aVar1 = col->field_1;
    pmVar7->field_0 = col->field_0;
    pmVar7->field_1 = aVar1;
    pmVar7->field_2 = (this->color).value.field_2;
    (this->color).holdsDefaultValue = false;
    requestRedraw();
  }
  ImGui::SameLine(0.0,-1.0);
  ImGui::PushItemWidth(100.0);
  bVar4 = ImGui::SliderFloat("Radius",&(this->radius).value.value,0.0,0.1,"%.5f",0x60);
  if (bVar4) {
    pmVar8 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::ScaledValue<float>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::ScaledValue<float>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::ScaledValue<float>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::ScaledValue<float>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&detail::persistentCache_scaledfloat,&(this->radius).name);
    uVar2 = *(undefined3 *)&(this->radius).value.field_0x1;
    fVar3 = (this->radius).value.value;
    pmVar8->relativeFlag = (this->radius).value.relativeFlag;
    *(undefined3 *)&pmVar8->field_0x1 = uVar2;
    pmVar8->value = fVar3;
    (this->radius).holdsDefaultValue = false;
    requestRedraw();
  }
  ImGui::PopItemWidth();
  return;
}

Assistant:

void CurveNetwork::buildCustomUI() {
  ImGui::Text("nodes: %lld  edges: %lld", static_cast<long long int>(nNodes()), static_cast<long long int>(nEdges()));
  if (ImGui::ColorEdit3("Color", &color.get()[0], ImGuiColorEditFlags_NoInputs)) {
    setColor(getColor());
  }
  ImGui::SameLine();
  ImGui::PushItemWidth(100);
  if (ImGui::SliderFloat("Radius", radius.get().getValuePtr(), 0.0, .1, "%.5f",
                         ImGuiSliderFlags_Logarithmic | ImGuiSliderFlags_NoRoundToFormat)) {
    radius.manuallyChanged();
    requestRedraw();
  }
  ImGui::PopItemWidth();
}